

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O2

void vera::shader(Shader *_program)

{
  size_t sVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  mat<4,_4,_float,_(glm::qualifier)0> *m1;
  mat4 *pmVar5;
  mat3 *_value;
  vec<3,_float,_(glm::qualifier)0> *v;
  vec3 *pvVar6;
  long lVar7;
  _Rb_tree_node_base *p_Var8;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *this;
  iterator it;
  float fVar9;
  vec<3,_float,_(glm::qualifier)0> vVar10;
  string name;
  allocator local_99;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined4 local_5c;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_58 [9];
  float local_34;
  
  if ((shaderPtr != fill_shader) || (shaderPtr != points_shader)) {
    shaderChange = 1;
    shaderPtr = _program;
  }
  _program->textureIndex = 0;
  Shader::use(_program);
  std::__cxx11::string::string((string *)&local_98,"u_date",&local_99);
  local_58._0_16_ = (undefined1  [16])getDate();
  Shader::setUniform(_program,(string *)&local_98,(vec4 *)local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"u_resolution",(allocator *)local_58);
  iVar3 = getWindowWidth();
  iVar4 = getWindowHeight();
  Shader::setUniform(_program,(string *)&local_98,(float)iVar3,(float)iVar4);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"u_mouse",(allocator *)local_58);
  local_34 = getMouseX();
  fVar9 = getMouseY();
  Shader::setUniform(_program,(string *)&local_98,local_34,fVar9);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"u_time",(allocator *)local_58);
  dVar2 = getTimeSec();
  Shader::setUniform(_program,(string *)&local_98,(float)dVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"u_delta",(allocator *)local_58);
  dVar2 = getDelta();
  Shader::setUniform(_program,(string *)&local_98,(float)dVar2);
  std::__cxx11::string::~string((string *)&local_98);
  if (fill_shader == _program) {
    std::__cxx11::string::string((string *)&local_98,"u_color",(allocator *)local_58);
    Shader::setUniform(_program,(string *)&local_98,(vec4 *)fill_color);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else if (points_shader == _program) {
    std::__cxx11::string::string((string *)&local_98,"u_size",(allocator *)local_58);
    Shader::setUniform(_program,(string *)&local_98,points_size);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_shape",(allocator *)local_58);
    Shader::setUniform(_program,(string *)&local_98,points_shape);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_color",(allocator *)local_58);
    Shader::setUniform(_program,(string *)&local_98,(vec4 *)fill_color);
    std::__cxx11::string::~string((string *)&local_98);
    glEnable(0x8861);
    glEnable(0x8642);
  }
  if (*(long *)(scene + 0x1f0) == 0) {
    std::__cxx11::string::string((string *)local_58,"u_modelViewProjectionMatrix",&local_99);
    pmVar5 = getFlippedOrthoMatrix();
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)&local_98,pmVar5,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)&matrix_world);
    Shader::setUniform(_program,(string *)local_58,(mat4 *)&local_98,false);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::string((string *)&local_98,"u_projectionMatrix",(allocator *)local_58);
    pmVar5 = getFlippedOrthoMatrix();
    Shader::setUniform(_program,(string *)&local_98,pmVar5,false);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)local_58,"u_viewMatrix",&local_99);
    local_98.x = 1.0;
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    uStack_88 = 0;
    uStack_84 = 0x3f800000;
    uStack_80 = 0;
    uStack_78 = 0;
    local_70 = 0x3f800000;
    local_6c = 0;
    uStack_64 = 0;
    local_5c = 0x3f800000;
    Shader::setUniform(_program,(string *)local_58,(mat4 *)&local_98,false);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::string((string *)local_58,"u_normalMatrix",&local_99);
    local_98.x = 1.0;
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    uStack_88 = 0x3f800000;
    uStack_84 = 0;
    uStack_80 = 0;
    uStack_78 = CONCAT44(uStack_78._4_4_,0x3f800000);
    Shader::setUniform(_program,(string *)local_58,(mat3 *)&local_98,false);
    this = local_58;
  }
  else {
    std::__cxx11::string::string((string *)local_58,"u_modelViewProjectionMatrix",&local_99);
    m1 = (mat<4,_4,_float,_(glm::qualifier)0> *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2d0))();
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)&local_98,m1,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)&matrix_world);
    Shader::setUniform(_program,(string *)local_58,(mat4 *)&local_98,false);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::string((string *)&local_98,"u_projectionMatrix",(allocator *)local_58);
    pmVar5 = (mat4 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2c8))();
    Shader::setUniform(_program,(string *)&local_98,pmVar5,false);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_normalMatrix",(allocator *)local_58);
    _value = (mat3 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2b8))();
    Shader::setUniform(_program,(string *)&local_98,_value,false);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_viewMatrix",(allocator *)local_58);
    pmVar5 = (mat4 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2b0))();
    Shader::setUniform(_program,(string *)&local_98,pmVar5,false);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_camera",&local_99);
    v = (vec<3,_float,_(glm::qualifier)0> *)(**(code **)(**(long **)(scene + 0x1f0) + 0x98))();
    vVar10 = glm::operator-(v);
    local_58._0_12_ = (undefined1  [12])vVar10;
    Shader::setUniform(_program,(string *)&local_98,(vec3 *)local_58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_cameraDistance",(allocator *)local_58);
    fVar9 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x278))();
    Shader::setUniform(_program,(string *)&local_98,fVar9);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_cameraNearClip",(allocator *)local_58);
    fVar9 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x270))();
    Shader::setUniform(_program,(string *)&local_98,fVar9);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_cameraFarClip",(allocator *)local_58);
    fVar9 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x268))();
    Shader::setUniform(_program,(string *)&local_98,fVar9);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_cameraEv100",(allocator *)local_58);
    fVar9 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x280))();
    Shader::setUniform(_program,(string *)&local_98,fVar9);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_cameraExposure",(allocator *)local_58);
    dVar2 = (double)(**(code **)(**(long **)(scene + 0x1f0) + 0x288))();
    Shader::setUniform(_program,(string *)&local_98,(float)dVar2);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_cameraAperture",(allocator *)local_58);
    fVar9 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x290))();
    Shader::setUniform(_program,(string *)&local_98,fVar9);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_cameraShutterSpeed",(allocator *)local_58);
    fVar9 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x298))();
    Shader::setUniform(_program,(string *)&local_98,fVar9);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_cameraSensitivity",(allocator *)local_58);
    fVar9 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x2a0))();
    Shader::setUniform(_program,(string *)&local_98,fVar9);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_cameraChange",(allocator *)local_58);
    Shader::setUniform(_program,(string *)&local_98,(uint)*(byte *)(*(long *)(scene + 0x1f0) + 0x20)
                      );
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"u_iblLuminance",(allocator *)local_58);
    dVar2 = (double)(**(code **)(**(long **)(scene + 0x1f0) + 0x288))();
    Shader::setUniform(_program,(string *)&local_98,(float)(dVar2 * 30000.0));
    this = &local_98;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::string((string *)&local_98,"u_modelMatrix",(allocator *)local_58);
  Shader::setUniform(_program,(string *)&local_98,(mat4 *)&matrix_world,false);
  std::__cxx11::string::~string((string *)&local_98);
  if (lights_enabled == '\x01') {
    p_Var8 = *(_Rb_tree_node_base **)(scene + 0xe0);
    if (*(long *)(scene + 0xf0) == 1) {
      std::__cxx11::string::string((string *)&local_98,"u_lightColor",(allocator *)local_58);
      Shader::setUniform(_program,(string *)&local_98,(vec3 *)(*(long *)(p_Var8 + 2) + 0xb0));
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string((string *)&local_98,"u_lightIntensity",(allocator *)local_58);
      Shader::setUniform(_program,(string *)&local_98,*(float *)(*(long *)(p_Var8 + 2) + 200));
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string((string *)&local_98,"u_light",(allocator *)local_58);
      pvVar6 = (vec3 *)(**(code **)(**(long **)(p_Var8 + 2) + 0x98))();
      Shader::setUniform(_program,(string *)&local_98,pvVar6);
      std::__cxx11::string::~string((string *)&local_98);
      lVar7 = *(long *)(p_Var8 + 2);
      if ((*(uint *)(lVar7 + 0x210) & 0xfffffffd) == 0) {
        std::__cxx11::string::string((string *)&local_98,"u_lightDirection",(allocator *)local_58);
        Shader::setUniform(_program,(string *)&local_98,(vec3 *)(*(long *)(p_Var8 + 2) + 0xbc));
        std::__cxx11::string::~string((string *)&local_98);
        lVar7 = *(long *)(p_Var8 + 2);
      }
      if (0.0 < *(float *)(lVar7 + 0xcc)) {
        std::__cxx11::string::string((string *)&local_98,"u_lightFalloff",(allocator *)local_58);
        Shader::setUniform(_program,(string *)&local_98,*(float *)(*(long *)(p_Var8 + 2) + 0xcc));
        std::__cxx11::string::~string((string *)&local_98);
      }
      std::__cxx11::string::string((string *)&local_98,"u_lightMatrix",(allocator *)local_58);
      Shader::setUniform(_program,(string *)&local_98,(mat4 *)(*(long *)(p_Var8 + 2) + 0x1c8),false)
      ;
      std::__cxx11::string::~string((string *)&local_98);
      if (*(char *)(*(long *)(p_Var8 + 2) + 0x100) == '\x01') {
        std::__cxx11::string::string((string *)&local_98,"u_lightShadowMap",(allocator *)local_58);
        lVar7 = *(long *)(p_Var8 + 2);
        sVar1 = _program->textureIndex;
        _program->textureIndex = sVar1 + 1;
        Shader::setUniformDepthTexture(_program,(string *)&local_98,(Fbo *)(lVar7 + 0xd0),sVar1);
        std::__cxx11::string::~string((string *)&local_98);
      }
    }
    else {
      for (; p_Var8 != (_Rb_tree_node_base *)(scene + 0xd0);
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_98,"u_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var8 + 1));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_98,"Color");
        Shader::setUniform(_program,(string *)local_58,(vec3 *)(*(long *)(p_Var8 + 2) + 0xb0));
        std::__cxx11::string::~string((string *)local_58);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_98,"Intensity");
        Shader::setUniform(_program,(string *)local_58,*(float *)(*(long *)(p_Var8 + 2) + 200));
        std::__cxx11::string::~string((string *)local_58);
        if ((int)(*(long **)(p_Var8 + 2))[0x42] == 0) {
LAB_00217c31:
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_98,"Direction");
          Shader::setUniform(_program,(string *)local_58,(vec3 *)(*(long *)(p_Var8 + 2) + 0xbc));
          std::__cxx11::string::~string((string *)local_58);
          lVar7 = *(long *)(p_Var8 + 2);
        }
        else {
          pvVar6 = (vec3 *)(**(code **)(**(long **)(p_Var8 + 2) + 0x98))();
          Shader::setUniform(_program,(string *)&local_98,pvVar6);
          lVar7 = *(long *)(p_Var8 + 2);
          if ((*(uint *)(lVar7 + 0x210) & 0xfffffffd) == 0) goto LAB_00217c31;
        }
        if (0.0 < *(float *)(lVar7 + 0xcc)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_98,"Falloff");
          Shader::setUniform(_program,(string *)local_58,*(float *)(*(long *)(p_Var8 + 2) + 0xcc));
          std::__cxx11::string::~string((string *)local_58);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_98,"Matrix");
        Shader::setUniform(_program,(string *)local_58,(mat4 *)(*(long *)(p_Var8 + 2) + 0x1c8),false
                          );
        std::__cxx11::string::~string((string *)local_58);
        if (*(char *)(*(long *)(p_Var8 + 2) + 0x100) == '\x01') {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_98,"ShadowMap");
          lVar7 = *(long *)(p_Var8 + 2);
          sVar1 = _program->textureIndex;
          _program->textureIndex = sVar1 + 1;
          Shader::setUniformDepthTexture(_program,(string *)local_58,(Fbo *)(lVar7 + 0xd0),sVar1);
          std::__cxx11::string::~string((string *)local_58);
        }
        std::__cxx11::string::~string((string *)&local_98);
      }
    }
  }
  return;
}

Assistant:

void shader(Shader* _program) {
    if (shaderPtr != fill_shader || shaderPtr != points_shader) {
        shaderPtr = _program; 
        shaderChange = true;
    }

    _program->textureIndex = 0;
    _program->use();

    _program->setUniform("u_date", getDate() );
    _program->setUniform("u_resolution", (float)getWindowWidth(), (float)getWindowHeight() );
    _program->setUniform("u_mouse", (float)getMouseX(), (float)getMouseY() );
    _program->setUniform("u_time", (float)getTimeSec() );
    _program->setUniform("u_delta", (float)getDelta() );

    if (_program == fill_shader)
        _program->setUniform("u_color", fill_color);
    else if (_program == points_shader) {
        _program->setUniform("u_size", points_size);
        _program->setUniform("u_shape", points_shape);
        _program->setUniform("u_color", fill_color);
        #if !defined(PLATFORM_RPI) && !defined(DRIVER_GBM) && !defined(_WIN32) && !defined(__EMSCRIPTEN__)
        glEnable(GL_POINT_SPRITE);
        glEnable(GL_VERTEX_PROGRAM_POINT_SIZE);
        #endif
    }

    if (scene->activeCamera) {
        _program->setUniform("u_modelViewProjectionMatrix", scene->activeCamera->getProjectionViewMatrix() * matrix_world );
        _program->setUniform("u_projectionMatrix", scene->activeCamera->getProjectionMatrix());
        _program->setUniform("u_normalMatrix", scene->activeCamera->getNormalMatrix());
        _program->setUniform("u_viewMatrix", scene->activeCamera->getViewMatrix() );

        _program->setUniform("u_camera", -scene->activeCamera->getPosition() );
        _program->setUniform("u_cameraDistance", scene->activeCamera->getDistance());
        _program->setUniform("u_cameraNearClip", scene->activeCamera->getNearClip());
        _program->setUniform("u_cameraFarClip", scene->activeCamera->getFarClip());
        _program->setUniform("u_cameraEv100", scene->activeCamera->getEv100());
        _program->setUniform("u_cameraExposure", float(scene->activeCamera->getExposure()));
        _program->setUniform("u_cameraAperture", scene->activeCamera->getAperture());
        _program->setUniform("u_cameraShutterSpeed", scene->activeCamera->getShutterSpeed());
        _program->setUniform("u_cameraSensitivity", scene->activeCamera->getSensitivity());
        _program->setUniform("u_cameraChange", scene->activeCamera->bChange);
        _program->setUniform("u_iblLuminance", float(30000.0f * scene->activeCamera->getExposure()));
    }
    else {
        _program->setUniform("u_modelViewProjectionMatrix", getFlippedOrthoMatrix() * matrix_world );
        _program->setUniform("u_projectionMatrix", getFlippedOrthoMatrix() );
        _program->setUniform("u_viewMatrix", glm::mat4(1.0f) );
        _program->setUniform("u_normalMatrix", glm::mat3(1.0f) );
    }

    _program->setUniform("u_modelMatrix", matrix_world );

    if (lights_enabled) {
        // Pass Light Uniforms
        if (scene->lights.size() == 1) {
            LightsMap::iterator it = scene->lights.begin();

            _program->setUniform("u_lightColor", it->second->color);
            _program->setUniform("u_lightIntensity", it->second->intensity);

            // if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
            _program->setUniform("u_light", it->second->getPosition());
            if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                _program->setUniform("u_lightDirection", it->second->direction);
            if (it->second->falloff > 0)
                _program->setUniform("u_lightFalloff", it->second->falloff);

            _program->setUniform("u_lightMatrix", it->second->getBiasMVPMatrix() );

            if (it->second->getShadowMap()->isAllocated())
                _program->setUniformDepthTexture("u_lightShadowMap", it->second->getShadowMap(), _program->textureIndex++ );
        }
        else {
            for (LightsMap::iterator it = scene->lights.begin(); it != scene->lights.end(); ++it) {
                std::string name = "u_" + it->first;

                _program->setUniform(name + "Color", it->second->color);
                _program->setUniform(name + "Intensity", it->second->intensity);
                if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
                    _program->setUniform(name, it->second->getPosition());
                if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                    _program->setUniform(name + "Direction", it->second->direction);
                if (it->second->falloff > 0)
                    _program->setUniform(name +"Falloff", it->second->falloff);

                _program->setUniform(name + "Matrix", it->second->getBiasMVPMatrix() );

                if (it->second->getShadowMap()->isAllocated())
                    _program->setUniformDepthTexture(name + "ShadowMap", it->second->getShadowMap(), _program->textureIndex++ );
            }
        } 
    }
}